

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O0

int64_t __thiscall
aeron::ClientConductor::addPublication(ClientConductor *this,string *channel,int32_t streamId)

{
  bool bVar1;
  __normal_iterator<aeron::ClientConductor::PublicationStateDefn_*,_std::vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>_>
  _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  reference pPVar3;
  undefined4 in_EDX;
  string *in_RSI;
  DriverProxy *in_RDI;
  int64_t registrationId;
  __normal_iterator<aeron::ClientConductor::PublicationStateDefn_*,_std::vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>_>
  it;
  int64_t id;
  lock_guard<std::recursive_mutex> lock;
  mutex_type *in_stack_ffffffffffffff28;
  __normal_iterator<aeron::ClientConductor::PublicationStateDefn_*,_std::vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>_>
  *in_stack_ffffffffffffff30;
  DriverProxy *__args_2;
  undefined8 in_stack_ffffffffffffff50;
  int32_t streamId_00;
  vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
  *this_00;
  string local_68 [16];
  anon_class_40_2_b9c55019_for__M_pred *in_stack_ffffffffffffffa8;
  __normal_iterator<aeron::ClientConductor::PublicationStateDefn_*,_std::vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>_>
  in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffbc;
  __normal_iterator<aeron::ClientConductor::PublicationStateDefn_*,_std::vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>_>
  in_stack_ffffffffffffffd0;
  vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
  *local_28;
  
  streamId_00 = (int32_t)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  verifyDriverIsActive((ClientConductor *)in_stack_ffffffffffffffd0._M_current);
  ensureOpen((ClientConductor *)in_stack_ffffffffffffffd0._M_current);
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28
            );
  std::
  vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
  ::begin((vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
           *)in_stack_ffffffffffffff28);
  std::
  vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
  ::end((vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
         *)in_stack_ffffffffffffff28);
  std::__cxx11::string::string(local_68,in_RSI);
  _Var2._M_current._4_4_ = in_stack_ffffffffffffffbc;
  _Var2._M_current._0_4_ = in_EDX;
  _Var2 = std::
          find_if<__gnu_cxx::__normal_iterator<aeron::ClientConductor::PublicationStateDefn*,std::vector<aeron::ClientConductor::PublicationStateDefn,std::allocator<aeron::ClientConductor::PublicationStateDefn>>>,aeron::ClientConductor::addPublication(std::__cxx11::string_const&,int)::__0>
                    (_Var2,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  addPublication(std::__cxx11::string_const&,int)::$_0::~__0
            ((anon_class_40_2_b9c55019_for__M_pred *)0x1c1997);
  std::
  vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
  ::end((vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
         *)in_stack_ffffffffffffff28);
  bVar1 = __gnu_cxx::operator==
                    (in_stack_ffffffffffffff30,
                     (__normal_iterator<aeron::ClientConductor::PublicationStateDefn_*,_std::vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>_>
                      *)in_stack_ffffffffffffff28);
  if (bVar1) {
    local_28 = (vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
                *)DriverProxy::addPublication(in_RDI,&(_Var2._M_current)->m_channel,streamId_00);
    __args_2 = in_RDI + 3;
    this_00 = local_28;
    __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::function<long_long_()>::operator()
                       ((function<long_long_()> *)&in_RDI[0x1d].m_clientId);
    std::
    vector<aeron::ClientConductor::PublicationStateDefn,std::allocator<aeron::ClientConductor::PublicationStateDefn>>
    ::emplace_back<std::__cxx11::string_const&,long&,int&,long_long>
              (this_00,__args,(long *)in_RSI,(int *)__args_2,(longlong *)in_stack_ffffffffffffff30);
  }
  else {
    pPVar3 = __gnu_cxx::
             __normal_iterator<aeron::ClientConductor::PublicationStateDefn_*,_std::vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>_>
             ::operator*((__normal_iterator<aeron::ClientConductor::PublicationStateDefn_*,_std::vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>_>
                          *)&stack0xffffffffffffffd0);
    local_28 = (vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
                *)pPVar3->m_registrationId;
  }
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x1c1ac0);
  return (int64_t)local_28;
}

Assistant:

std::int64_t ClientConductor::addPublication(const std::string &channel, std::int32_t streamId)
{
    verifyDriverIsActive();
    ensureOpen();

    std::lock_guard<std::recursive_mutex> lock(m_adminLock);
    std::int64_t id;

    auto it = std::find_if(m_publications.begin(), m_publications.end(),
        [channel, streamId](const PublicationStateDefn &entry)
        {
            return (streamId == entry.m_streamId && channel == entry.m_channel);
        });

    if (it == m_publications.end())
    {
        std::int64_t registrationId = m_driverProxy.addPublication(channel, streamId);

        m_publications.emplace_back(channel, registrationId, streamId, m_epochClock());
        id = registrationId;
    }
    else
    {
        id = (*it).m_registrationId;
    }

    return id;
}